

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcpclient.cpp
# Opt level: O2

void __thiscall uv::TCPClient::send_inl(TCPClient *this,uv_write_t *req)

{
  list<uv::_write_param_*,_std::allocator<uv::_write_param_*>_> *this_00;
  _List_node_base *p_Var1;
  FILE *__stream;
  int errcode;
  ssize_t sVar2;
  CStringStream *pCVar3;
  ILog4zManager *pIVar4;
  undefined8 uVar5;
  size_t in_RCX;
  uv_mutex_t *puVar6;
  long *in_FS_OFFSET;
  write_param *writep;
  char *local_88;
  uv_mutex_t *local_80;
  char *local_78;
  PodCircularBuffer<char> *local_70;
  CStringStream ss;
  string local_50;
  
  writep = (write_param *)req;
  if (req != (uv_write_t *)0x0) {
    if ((this->writeparam_list_).
        super__List_base<uv::_write_param_*,_std::allocator<uv::_write_param_*>_>._M_impl._M_node.
        _M_size < 0x15) {
      std::__cxx11::list<uv::_write_param_*,_std::allocator<uv::_write_param_*>_>::push_back
                (&this->writeparam_list_,&writep);
    }
    else {
      FreeWriteParam((write_param *)req);
    }
  }
  local_80 = &this->mutex_writebuf_;
  local_70 = &this->write_circularbuf_;
  this_00 = &this->writeparam_list_;
  local_78 = (char *)*in_FS_OFFSET;
  local_88 = local_78 + -0x800;
  puVar6 = local_80;
  while( true ) {
    uv_mutex_lock(puVar6);
    if ((this->write_circularbuf_).m_bEmpty == true) break;
    p_Var1 = (this_00->super__List_base<uv::_write_param_*,_std::allocator<uv::_write_param_*>_>).
             _M_impl._M_node.super__List_node_base._M_next;
    if (p_Var1 == (_List_node_base *)this_00) {
      writep = AllocWriteParam();
      (writep->write_req_).data = this;
    }
    else {
      writep = (write_param *)p_Var1[1]._M_next;
      std::__cxx11::list<uv::_write_param_*,_std::allocator<uv::_write_param_*>_>::pop_front
                (this_00);
    }
    sVar2 = PodCircularBuffer<char>::read
                      (local_70,(int)(writep->buf_).base,(void *)(ulong)(uint)writep->buf_truelen_,
                       in_RCX);
    (writep->buf_).len = (long)(int)sVar2;
    uv_mutex_unlock(puVar6);
    in_RCX = 1;
    errcode = uv_write(writep,this->client_handle_,&writep->buf_,1,AfterSend);
    if (errcode != 0) {
      std::__cxx11::list<uv::_write_param_*,_std::allocator<uv::_write_param_*>_>::push_back
                (this_00,&writep);
      ss.m_pBegin = local_88;
      ss.m_pEnd = local_78;
      ss.m_pCur = local_88;
      pCVar3 = zsummer::log4z::CStringStream::operator<<(&ss,"client(");
      pCVar3 = zsummer::log4z::CStringStream::operator<<(pCVar3,this);
      pCVar3 = zsummer::log4z::CStringStream::operator<<(pCVar3,") send error:");
      GetUVError_abi_cxx11_(&local_50,errcode);
      zsummer::log4z::CStringStream::operator<<(pCVar3,&local_50);
      std::__cxx11::string::~string((string *)&local_50);
      pCVar3 = zsummer::log4z::CStringStream::operator<<(&ss," ( ");
      pCVar3 = zsummer::log4z::CStringStream::operator<<(pCVar3," ");
      pCVar3 = zsummer::log4z::CStringStream::operator<<(pCVar3," ) : ");
      zsummer::log4z::CStringStream::operator<<(pCVar3,0x1e9);
      pIVar4 = zsummer::log4z::ILog4zManager::GetInstance();
      (*pIVar4->_vptr_ILog4zManager[8])(pIVar4,0,3,local_88);
      __stream = _stdout;
      uVar5 = uv_err_name(errcode);
      in_RCX = uv_strerror(errcode);
      fprintf(__stream,"send error. %s-%s\n",uVar5);
      puVar6 = local_80;
    }
  }
  uv_mutex_unlock(puVar6);
  return;
}

Assistant:

void TCPClient::send_inl(uv_write_t* req /*= NULL*/)
{
    write_param* writep = (write_param*)req;
    if (writep) {
        if (writeparam_list_.size() > MAXLISTSIZE) {
            FreeWriteParam(writep);
        } else {
            writeparam_list_.push_back(writep);
        }
    }
    while (true) {
        uv_mutex_lock(&mutex_writebuf_);
        if (write_circularbuf_.empty()) {
            uv_mutex_unlock(&mutex_writebuf_);
            break;
        }
        if (writeparam_list_.empty()) {
            writep = AllocWriteParam();
            writep->write_req_.data = this;
        } else {
            writep = writeparam_list_.front();
            writeparam_list_.pop_front();
        }
        writep->buf_.len = write_circularbuf_.read(writep->buf_.base, writep->buf_truelen_); 
        uv_mutex_unlock(&mutex_writebuf_);
        int iret = uv_write((uv_write_t*)&writep->write_req_, (uv_stream_t*)&client_handle_->tcphandle, &writep->buf_, 1, AfterSend);
        if (iret) {
            writeparam_list_.push_back(writep);//failure not call AfterSend. so recycle req
            LOGE("client(" << this << ") send error:" << GetUVError(iret));
            fprintf(stdout, "send error. %s-%s\n", uv_err_name(iret), uv_strerror(iret));
        }
    }
}